

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write_exponent<char,fmt::v7::detail::buffer_appender<char>>
          (int exp,buffer_appender<char> it)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  char local_2e [3];
  char local_2b;
  char local_2a;
  char local_29;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      local_2e[0] = '-';
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,local_2e);
      exp = -exp;
    }
    else {
      local_2e[1] = 0x2b;
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 local_2e + 1);
    }
    uVar3 = exp;
    if (99 < (uint)exp) {
      uVar3 = (exp & 0xffffU) % 100;
      uVar2 = (ulong)(ushort)((exp & 0xffffU) / 100);
      if (999 < (uint)exp) {
        local_2e[2] = basic_data<void>::digits[uVar2 * 2];
        buffer<char>::push_back
                  ((buffer<char> *)
                   it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                   local_2e + 2);
      }
      local_2b = basic_data<void>::digits[uVar2 * 2 + 1];
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_2b);
    }
    local_2a = basic_data<void>::digits[(ulong)uVar3 * 2];
    cVar1 = basic_data<void>::digits[(ulong)uVar3 * 2 + 1];
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_2a);
    local_29 = cVar1;
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_29);
    return (buffer_appender<char>)
           it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
              ,0x452,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}